

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O2

void __thiscall BanMan::SweepBanned(BanMan *this)

{
  long lVar1;
  _Base_ptr p_Var2;
  bool bVar3;
  bool bVar4;
  int64_t iVar5;
  _Base_ptr p_Var6;
  iterator __position;
  banmap_t *category;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  string local_90;
  CSubNet sub_net;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = GetTime();
  bVar4 = false;
  __position._M_node = (this->m_banned)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)__position._M_node !=
         &(this->m_banned)._M_t._M_impl.super__Rb_tree_header) {
    CSubNet::CSubNet(&sub_net,(CSubNet *)(__position._M_node + 1));
    p_Var2 = __position._M_node[3]._M_parent;
    bVar3 = CSubNet::IsValid(&sub_net);
    p_Var6 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    if (!bVar3 || (long)p_Var2 < iVar5) {
      category = &this->m_banned;
      std::
      _Rb_tree<CSubNet,std::pair<CSubNet_const,CBanEntry>,std::_Select1st<std::pair<CSubNet_const,CBanEntry>>,std::less<CSubNet>,std::allocator<std::pair<CSubNet_const,CBanEntry>>>
      ::erase_abi_cxx11_((_Rb_tree<CSubNet,std::pair<CSubNet_const,CBanEntry>,std::_Select1st<std::pair<CSubNet_const,CBanEntry>>,std::less<CSubNet>,std::allocator<std::pair<CSubNet_const,CBanEntry>>>
                          *)&this->m_banned,__position);
      this->m_is_dirty = true;
      bVar4 = ::LogAcceptCategory((LogFlags)category,(Level)__position._M_node);
      if (bVar4) {
        CSubNet::ToString_abi_cxx11_(&local_90,&sub_net);
        bVar4 = true;
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/banman.cpp"
        ;
        source_file._M_len = 0x5a;
        logging_function._M_str = "SweepBanned";
        logging_function._M_len = 0xb;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function,source_file,0xc4,NET,Debug,(ConstevalFormatString<1U>)0xc8c75d,
                   &local_90);
        std::__cxx11::string::~string((string *)&local_90);
      }
      else {
        bVar4 = true;
      }
    }
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&sub_net);
    __position._M_node = p_Var6;
  }
  if ((bVar4) && (this->m_client_interface != (CClientUIInterface *)0x0)) {
    CClientUIInterface::BannedListChanged(this->m_client_interface);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BanMan::SweepBanned()
{
    AssertLockHeld(m_banned_mutex);

    int64_t now = GetTime();
    bool notify_ui = false;
    banmap_t::iterator it = m_banned.begin();
    while (it != m_banned.end()) {
        CSubNet sub_net = (*it).first;
        CBanEntry ban_entry = (*it).second;
        if (!sub_net.IsValid() || now > ban_entry.nBanUntil) {
            m_banned.erase(it++);
            m_is_dirty = true;
            notify_ui = true;
            LogDebug(BCLog::NET, "Removed banned node address/subnet: %s\n", sub_net.ToString());
        } else {
            ++it;
        }
    }

    // update UI
    if (notify_ui && m_client_interface) {
        m_client_interface->BannedListChanged();
    }
}